

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindIssueData
          (UnblindParameter *__return_storage_ptr__,Privkey *blinding_key,ByteData *rangeproof,
          ConfidentialValue *value_commitment,Script *extra,ConfidentialAssetId *asset)

{
  pointer *this;
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  uchar *puVar4;
  size_type sVar5;
  uchar *puVar6;
  size_type sVar7;
  undefined8 uVar8;
  uchar *extra_00;
  size_type extra_len;
  uchar *generator_00;
  string *message;
  uchar *asset_out_00;
  UnblindParameter *this_00;
  uchar *abf_out_00;
  size_type abf_out_len;
  uchar *vbf_out_00;
  size_type vbf_out_len;
  Amount AVar9;
  string *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  CfdError CVar10;
  CfdException *in_stack_fffffffffffffad0;
  Amount local_378;
  ConfidentialValue local_368;
  ByteData256 local_340;
  BlindFactor local_328;
  ByteData256 local_308;
  BlindFactor local_2f0;
  ByteData local_2d0;
  ConfidentialAssetId local_2b8;
  undefined1 local_28b;
  undefined1 local_28a;
  allocator local_289;
  string local_288 [32];
  CfdSourceLocation local_268;
  uint64_t local_250;
  uint64_t value_out;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  string local_1e0 [32];
  CfdSourceLocation local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  undefined1 local_170 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  int ret;
  ConfidentialAssetId *asset_local;
  Script *extra_local;
  ConfidentialValue *value_commitment_local;
  ByteData *rangeproof_local;
  Privkey *blinding_key_local;
  UnblindParameter *result;
  
  Privkey::GetData(&local_98,blinding_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,&local_98);
  ByteData::~ByteData((ByteData *)0x4e3762);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &commitment_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,rangeproof);
  ConfidentialValue::GetData
            ((ByteData *)
             &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,value_commitment);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                     (ByteData *)
                     &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4e37a7);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e37b3);
  bVar1 = Script::IsEmpty(extra);
  if (!bVar1) {
    Script::GetData((ByteData *)
                    &empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,extra);
    ByteData::GetBytes(&local_120,
                       (ByteData *)
                       &empty_factor.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_108,&local_120);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffac0);
    ByteData::~ByteData((ByteData *)0x4e3826);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e38ec);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8,(allocator_type *)in_stack_fffffffffffffac0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e3912);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3925);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  memset(puVar2,0,sVar3);
  ConfidentialAssetId::GetUnblindedData
            ((ByteData *)
             &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
                     (ByteData *)
                     &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x4e397c);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e398f);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad0,
             in_stack_fffffffffffffac8,(allocator_type *)in_stack_fffffffffffffac0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e39b5);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e39f5);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3a22);
  sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a0);
  nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       wally_asset_generator_from_bytes(puVar2,sVar3,puVar4,sVar5,puVar6,sVar7);
  if (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e3c52);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8,(allocator_type *)in_stack_fffffffffffffac0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e3c78);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e3c8b);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8,(allocator_type *)in_stack_fffffffffffffac0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e3cb1);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e3cc4);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8,(allocator_type *)in_stack_fffffffffffffac0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e3cea);
    local_250 = 0;
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    this = &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    extra_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3d8c);
    extra_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_108);
    generator_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3db9);
    message = (string *)
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a0);
    asset_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3dde);
    this_00 = (UnblindParameter *)
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
    abf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3e03);
    abf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
    vbf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4e3e2c);
    vbf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
    nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         wally_asset_unblind_with_nonce
                   (puVar2,sVar3,puVar4,sVar5,puVar6,sVar7,extra_00,extra_len,generator_00,
                    (size_t)message,asset_out_00,(size_t)this_00,abf_out_00,abf_out_len,vbf_out_00,
                    vbf_out_len,&local_250);
    CVar10 = (CfdError)((ulong)asset_out_00 >> 0x20);
    if (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      local_28b = 0;
      UnblindParameter::UnblindParameter(this_00);
      ByteData::ByteData(&local_2d0,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      ConfidentialAssetId::ConfidentialAssetId(&local_2b8,&local_2d0);
      ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_2b8);
      ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4e40fc);
      ByteData::~ByteData((ByteData *)0x4e4108);
      ByteData256::ByteData256
                (&local_308,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      BlindFactor::BlindFactor(&local_2f0,&local_308);
      BlindFactor::operator=(&__return_storage_ptr__->abf,&local_2f0);
      BlindFactor::~BlindFactor((BlindFactor *)0x4e4157);
      ByteData256::~ByteData256((ByteData256 *)0x4e4163);
      ByteData256::ByteData256
                (&local_340,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      BlindFactor::BlindFactor(&local_328,&local_340);
      BlindFactor::operator=(&__return_storage_ptr__->vbf,&local_328);
      BlindFactor::~BlindFactor((BlindFactor *)0x4e41b2);
      ByteData256::~ByteData256((ByteData256 *)0x4e41be);
      AVar9 = Amount::CreateBySatoshiAmount(local_250);
      local_378.amount_ = AVar9.amount_;
      local_378.ignore_check_ = AVar9.ignore_check_;
      ConfidentialValue::ConfidentialValue(&local_368,&local_378);
      ConfidentialValue::operator=(&__return_storage_ptr__->value,&local_368);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e4247);
      local_28b = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
      return __return_storage_ptr__;
    }
    local_268.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_268.filename = local_268.filename + 1;
    local_268.line = 0xbf2;
    local_268.funcname = "CalculateUnblindIssueData";
    logger::warn<int&>(&local_268,"wally_asset_unblind_with_nonce NG[{}].",
                       (int *)((long)&nonce_bytes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_28a = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_288,"unblind confidential data error.",&local_289);
    CfdException::CfdException((CfdException *)this_00,CVar10,message);
    local_28a = 0;
    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  CVar10 = (CfdError)(in_stack_fffffffffffffac8 >> 0x20);
  local_1c0.filename = local_1c0.filename + 1;
  local_1c0.line = 0xbe2;
  local_1c0.funcname = "CalculateUnblindIssueData";
  logger::warn<int&>(&local_1c0,"wally_asset_generator_from_bytes NG[{}].",
                     (int *)((long)&nonce_bytes.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  uVar8 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_1e0,"asset generator error.",
             (allocator *)
             ((long)&abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CfdException::CfdException(in_stack_fffffffffffffad0,CVar10,in_stack_fffffffffffffac0);
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindIssueData(
    const Privkey &blinding_key, const ByteData &rangeproof,
    const ConfidentialValue &value_commitment, const Script &extra,
    const ConfidentialAssetId &asset) {
  int ret;
  const std::vector<uint8_t> nonce_bytes = blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  std::vector<uint8_t> extra_bytes;
  if (!extra.IsEmpty()) {
    extra_bytes = extra.GetData().GetBytes();
  }

  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  memset(empty_factor.data(), 0, empty_factor.size());
  const std::vector<uint8_t> asset_bytes = asset.GetUnblindedData().GetBytes();
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), empty_factor.data(),
      empty_factor.size(), generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "asset generator error.");
  }

  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  ret = wally_asset_unblind_with_nonce(
      nonce_bytes.data(), nonce_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      generator.data(), generator.size(), asset_out.data(), asset_out.size(),
      abf_out.data(), abf_out.size(), vbf_out.data(), vbf_out.size(),
      &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind_with_nonce NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));
  return result;
}